

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAndiRg<(moira::Instr)57,(moira::Mode)0,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  Imu<1> im;
  StrWriter *pSVar2;
  
  im.raw = dasmIncRead<1>(this,addr);
  SVar1 = str->style->syntax;
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  if (SVar1 == MUSASHI) {
    pSVar2 = StrWriter::operator<<(pSVar2,im);
  }
  else {
    pSVar2 = StrWriter::operator<<(pSVar2,(Ims<1>)im.raw);
  }
  StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Dn)(op & 7));
  return;
}

Assistant:

void
Moira::dasmAndiRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = _____________xxx(op);

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << Dn{dst};
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << Sep{} << Dn{dst};
    }
}